

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXImporter.cpp
# Opt level: O0

void __thiscall
Assimp::FBXImporter::InternReadFile
          (FBXImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  bool bVar1;
  int iVar2;
  IOStream *__p;
  pointer pIVar3;
  undefined4 extraout_var;
  reference pcVar4;
  size_type sVar5;
  reference pvVar6;
  FileGlobalSettings *this_00;
  iterator iVar7;
  iterator iVar8;
  float fVar9;
  exception *anon_var_0;
  undefined1 local_260 [4];
  float size_relative_to_cm;
  Document doc;
  Parser parser;
  undefined1 local_d8 [7];
  bool is_binary;
  TokenList tokens;
  char *begin;
  undefined1 local_a8 [8];
  vector<char,_std::allocator<char>_> contents;
  string local_88;
  allocator<char> local_51;
  string local_50;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_30;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> stream;
  IOSystem *pIOHandler_local;
  aiScene *pScene_local;
  string *pFile_local;
  FBXImporter *this_local;
  
  stream._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
  super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       pIOHandler;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"rb",&local_51);
  __p = IOSystem::Open(pIOHandler,pFile,&local_50);
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_30,__p);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_30);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"Could not open file for reading",
               (allocator<char> *)
               &contents.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
    LogFunctions<Assimp::FBXImporter>::ThrowException(&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               &contents.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
  }
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)local_a8);
  pIVar3 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                     (&local_30);
  iVar2 = (*pIVar3->_vptr_IOStream[6])();
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)local_a8,CONCAT44(extraout_var,iVar2) + 1);
  pIVar3 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                     (&local_30);
  begin = (char *)std::vector<char,_std::allocator<char>_>::begin
                            ((vector<char,_std::allocator<char>_> *)local_a8);
  pcVar4 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
           operator*((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *)&begin)
  ;
  sVar5 = std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)local_a8);
  (*pIVar3->_vptr_IOStream[2])(pIVar3,pcVar4,1,sVar5 - 1);
  sVar5 = std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)local_a8);
  pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_a8,sVar5 - 1);
  *pvVar6 = '\0';
  tokens.super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::vector<char,_std::allocator<char>_>::begin
                          ((vector<char,_std::allocator<char>_> *)local_a8);
  pcVar4 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
           operator*((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *)
                     &tokens.
                      super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::vector
            ((vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_> *)
             local_d8);
  iVar2 = strncmp(pcVar4,"Kaydara FBX Binary",0x12);
  if (iVar2 != 0) {
    FBX::Tokenize((TokenList *)local_d8,pcVar4);
  }
  else {
    sVar5 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)local_a8);
    FBX::TokenizeBinary((TokenList *)local_d8,pcVar4,sVar5);
  }
  parser._47_1_ = iVar2 == 0;
  FBX::Parser::Parser((Parser *)&doc.globals,(TokenList *)local_d8,(bool)parser._47_1_);
  FBX::Document::Document((Document *)local_260,(Parser *)&doc.globals,&this->settings);
  FBX::ConvertToAssimpScene
            (pScene,(Document *)local_260,(bool)((this->settings).removeEmptyBones & 1));
  this_00 = FBX::Document::GlobalSettings((Document *)local_260);
  fVar9 = FBX::FileGlobalSettings::UnitScaleFactor(this_00);
  (*(this->super_BaseImporter)._vptr_BaseImporter[6])((double)(fVar9 * 0.01));
  iVar7 = std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
          begin((vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_> *)
                local_d8);
  iVar8 = std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::end
                    ((vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                      *)local_d8);
  std::
  for_each<__gnu_cxx::__normal_iterator<Assimp::FBX::Token_const**,std::vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>>,Assimp::FBX::Util::delete_fun<Assimp::FBX::Token>>
            (iVar7._M_current,iVar8._M_current);
  FBX::Document::~Document((Document *)local_260);
  FBX::Parser::~Parser((Parser *)&doc.globals);
  std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::~vector
            ((vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_> *)
             local_d8);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_a8)
  ;
  std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr(&local_30);
  return;
}

Assistant:

void FBXImporter::InternReadFile(const std::string &pFile, aiScene *pScene, IOSystem *pIOHandler) {
	std::unique_ptr<IOStream> stream(pIOHandler->Open(pFile, "rb"));
	if (!stream) {
		ThrowException("Could not open file for reading");
	}

	// read entire file into memory - no streaming for this, fbx
	// files can grow large, but the assimp output data structure
	// then becomes very large, too. Assimp doesn't support
	// streaming for its output data structures so the net win with
	// streaming input data would be very low.
	std::vector<char> contents;
	contents.resize(stream->FileSize() + 1);
	stream->Read(&*contents.begin(), 1, contents.size() - 1);
	contents[contents.size() - 1] = 0;
	const char *const begin = &*contents.begin();

	// broadphase tokenizing pass in which we identify the core
	// syntax elements of FBX (brackets, commas, key:value mappings)
	TokenList tokens;
	try {

		bool is_binary = false;
		if (!strncmp(begin, "Kaydara FBX Binary", 18)) {
			is_binary = true;
			TokenizeBinary(tokens, begin, contents.size());
		} else {
			Tokenize(tokens, begin);
		}

		// use this information to construct a very rudimentary
		// parse-tree representing the FBX scope structure
		Parser parser(tokens, is_binary);

		// take the raw parse-tree and convert it to a FBX DOM
		Document doc(parser, settings);

		// convert the FBX DOM to aiScene
		ConvertToAssimpScene(pScene, doc, settings.removeEmptyBones);

		// size relative to cm
		float size_relative_to_cm = doc.GlobalSettings().UnitScaleFactor();

		// Set FBX file scale is relative to CM must be converted to M for
		// assimp universal format (M)
		SetFileScale(size_relative_to_cm * 0.01f);

		std::for_each(tokens.begin(), tokens.end(), Util::delete_fun<Token>());
	} catch (std::exception &) {
		std::for_each(tokens.begin(), tokens.end(), Util::delete_fun<Token>());
		throw;
	}
}